

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,OptionType *aOptionNumber,OptionValue *aOptionValue
                  ,uint16_t aLastOptionNumber,ByteArray *aBuf,size_t *aOffset)

{
  byte bVar1;
  char cVar2;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar3;
  pointer puVar4;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *paVar5;
  char *pcVar6;
  char *pcVar7;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar8;
  long lVar9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  ushort uVar10;
  byte bVar11;
  ushort uVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar13;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar14;
  long lVar15;
  ulong uVar16;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string sStack_b8;
  writer write;
  undefined1 local_90 [40];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pvVar3 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)*aOffset;
  puVar4 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
           ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish + -(long)puVar4);
  if (pvVar3 < pvVar8) {
    bVar1 = *(byte *)((long)&pvVar3->field_0 + (long)puVar4);
    uVar12 = bVar1 & 0xf;
    lVar15 = 1;
    if (0xcf < bVar1) {
      lVar15 = 3 - (ulong)(bVar1 < 0xe0);
    }
    bVar11 = (byte)uVar12;
    lVar9 = 0;
    if (0xc < bVar11) {
      lVar9 = (ulong)(uVar12 != 0xd) + 1;
    }
    aVar13.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
         ((long)&pvVar3->field_0 + lVar9 + lVar15);
    if (pvVar8 < (ulong)aVar13) {
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of a CoAP option";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      pcVar6 = "premature end of a CoAP option";
      local_68.context_.types_ = local_68.types_;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_68);
        }
      }
      args_00.field_1.values_ = aVar13.values_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&sStack_b8,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),
                 args_00);
      local_90._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&sStack_b8);
    }
    else {
      uVar10 = (ushort)(bVar1 >> 4);
      if (bVar1 < 0xd0) {
        pvVar14 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                  ((long)&pvVar3->field_0 + 1);
      }
      else if (uVar10 == 0xe) {
        uVar10 = *(ushort *)((long)&pvVar3->field_0 + (long)(puVar4 + 1));
        uVar10 = (uVar10 << 8 | uVar10 >> 8) + 0x10d;
        pvVar14 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                  ((long)&pvVar3->field_0 + 3);
      }
      else {
        if (uVar10 != 0xd) {
          if (bVar11 == 0xf) {
            local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "cannot find more CoAP option";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1c;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
            local_68.parse_funcs_[0] = (parse_func)0x0;
            pcVar6 = "cannot find more CoAP option";
            local_68.context_.types_ = local_68.types_;
            while (pcVar7 = pcVar6, pcVar7 != "") {
              pcVar6 = pcVar7 + 1;
              if (*pcVar7 == '}') {
                if ((pcVar6 == "") || (*pcVar6 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar6 = pcVar7 + 2;
              }
              else if (*pcVar7 == '{') {
                pcVar6 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                   (pcVar7,"",&local_68);
              }
            }
            args_03.field_1.values_ = aVar13.values_;
            args_03.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_
                      (&sStack_b8,(v10 *)"cannot find more CoAP option",(string_view)ZEXT816(0x1c),
                       args_03);
            local_90._0_4_ = kNotFound;
            std::__cxx11::string::string((string *)(local_90 + 8),(string *)&sStack_b8);
          }
          else {
            local_68.types_[0] = uint_type;
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "invalid CoAP option (firstByte={:X})";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
            local_68.parse_funcs_[0] =
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
            pcVar6 = "invalid CoAP option (firstByte={:X})";
            write.handler_ = &local_68;
            local_68.context_.types_ = local_68.types_;
            while (pcVar6 != "") {
              cVar2 = *pcVar6;
              pcVar7 = pcVar6;
              while (cVar2 != '{') {
                pcVar7 = pcVar7 + 1;
                if (pcVar7 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
                  ::writer::operator()(&write,pcVar6,"");
                  goto LAB_0019ed0a;
                }
                cVar2 = *pcVar7;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()(&write,pcVar6,pcVar7);
              pcVar6 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                                 (pcVar7,"",&local_68);
            }
LAB_0019ed0a:
            local_68._0_8_ =
                 ZEXT18(*(byte *)((long)&pvVar3->field_0 +
                                 (long)(aBuf->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
            fmt_00.size_ = 2;
            fmt_00.data_ = (char *)0x24;
            args_04.field_1.values_ = aVar13.values_;
            args_04.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_
                      (&sStack_b8,(v10 *)"invalid CoAP option (firstByte={:X})",fmt_00,args_04);
            local_90._0_4_ = kBadFormat;
            std::__cxx11::string::string((string *)(local_90 + 8),(string *)&sStack_b8);
          }
          goto LAB_0019ed47;
        }
        pvVar14 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                  ((long)&pvVar3->field_0 + 2);
        uVar10 = *(byte *)((long)&pvVar3->field_0 + (long)(puVar4 + 1)) + 0xd;
      }
      if (0xc < bVar11) {
        if (bVar11 == 0xe) {
          uVar12 = *(ushort *)((long)&pvVar14->field_0 + (long)puVar4);
          uVar12 = (uVar12 << 8 | uVar12 >> 8) + 0x10d;
          pvVar14 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    ((long)&pvVar14->field_0 + 2);
        }
        else {
          if (uVar12 != 0xd) {
            local_68.types_[0] = uint_type;
            local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "invalid CoAP option (firstByte={:X})";
            local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
            local_68.parse_funcs_[0] =
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
            pcVar6 = "invalid CoAP option (firstByte={:X})";
            write.handler_ = &local_68;
            local_68.context_.types_ = local_68.types_;
            while (pcVar6 != "") {
              cVar2 = *pcVar6;
              pcVar7 = pcVar6;
              while (cVar2 != '{') {
                pcVar7 = pcVar7 + 1;
                if (pcVar7 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
                  ::writer::operator()(&write,pcVar6,"");
                  goto LAB_0019ebed;
                }
                cVar2 = *pcVar7;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()(&write,pcVar6,pcVar7);
              pcVar6 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                                 (pcVar7,"",&local_68);
            }
LAB_0019ebed:
            local_68._0_8_ =
                 ZEXT18(*(byte *)((long)&pvVar3->field_0 +
                                 (long)(aBuf->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_start));
            fmt.size_ = 2;
            fmt.data_ = (char *)0x24;
            args_02.field_1.values_ = aVar13.values_;
            args_02.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_
                      (&sStack_b8,(v10 *)"invalid CoAP option (firstByte={:X})",fmt,args_02);
            local_90._0_4_ = kBadFormat;
            std::__cxx11::string::string((string *)(local_90 + 8),(string *)&sStack_b8);
            goto LAB_0019ed47;
          }
          paVar5 = &pvVar14->field_0;
          pvVar14 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                    ((long)&pvVar14->field_0 + 1);
          uVar12 = *(byte *)((long)paVar5 + (long)puVar4) + 0xd;
        }
      }
      if (aVar13.values_ != pvVar14) {
        abort();
      }
      uVar16 = (ulong)uVar12;
      if ((value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
          ((long)&(aVar13.values_)->field_0 + uVar16) <= pvVar8) {
        *aOptionNumber = uVar10 + aLastOptionNumber;
        __first._M_current = (uchar *)((long)&(aVar13.values_)->field_0 + (long)puVar4);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_90,__first,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + uVar16),(allocator_type *)&sStack_b8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&aOptionValue->mValue,&local_68);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
        *aOffset = *aOffset + uVar16 + lVar9 + lVar15;
        return __return_storage_ptr__;
      }
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of a CoAP option";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_68.parse_funcs_[0] = (parse_func)0x0;
      pcVar6 = "premature end of a CoAP option";
      local_68.context_.types_ = local_68.types_;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_68);
        }
      }
      args_01.field_1.values_ = aVar13.values_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&sStack_b8,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),
                 args_01);
      local_90._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&sStack_b8);
    }
  }
  else {
    local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of a CoAP option";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "premature end of a CoAP option";
    local_68.context_.types_ = local_68.types_;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_68);
      }
    }
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_b8,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),args);
    local_90._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&sStack_b8);
  }
LAB_0019ed47:
  Error::operator=(__return_storage_ptr__,(Error *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 8));
  std::__cxx11::string::~string((string *)&sStack_b8);
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(OptionType      &aOptionNumber,
                           OptionValue     &aOptionValue,
                           uint16_t         aLastOptionNumber,
                           const ByteArray &aBuf,
                           size_t          &aOffset)
{
    Error    error;
    uint16_t delta;
    uint16_t length;
    uint16_t valueLength;
    size_t   firstByte = aOffset;
    size_t   extend    = aOffset + 1;

    VerifyOrExit(firstByte < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    delta       = aBuf[firstByte] >> 4;
    valueLength = aBuf[firstByte] & 0x0f;

    length = 1;
    length += delta < kOption1ByteExtension ? 0 : (delta < kOption2ByteExtension ? 1 : 2);
    length += valueLength < kOption1ByteExtension ? 0 : (valueLength < kOption2ByteExtension ? 1 : 2);

    VerifyOrExit(firstByte + length <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    if (delta < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (delta == kOption1ByteExtension)
    {
        delta = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (delta == kOption2ByteExtension)
    {
        delta = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        // we have delta == 0x0f

        VerifyOrExit(valueLength == 0x0f,
                     error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
        ExitNow(error = ERROR_NOT_FOUND("cannot find more CoAP option"));
    }

    if (valueLength < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (valueLength == kOption1ByteExtension)
    {
        valueLength = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (valueLength == kOption2ByteExtension)
    {
        valueLength = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
    }

    VerifyOrDie(firstByte + length == extend);

    VerifyOrExit(valueLength + extend <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    aOptionNumber = utils::from_underlying<OptionType>(aLastOptionNumber + delta);
    aOptionValue  = OptionValue{ByteArray{aBuf.begin() + extend, aBuf.begin() + extend + valueLength}};

    aOffset += length + valueLength;

exit:
    return error;
}